

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O0

err_t beltHash(octet *hash,void *src,size_t count)

{
  bool_t bVar1;
  blob_t state_00;
  octet *in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *state;
  size_t in_stack_ffffffffffffffd8;
  
  bVar1 = memIsValid(in_RSI,(size_t)in_RDX);
  if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,0x20), bVar1 != 0)) {
    beltHash_keep();
    state_00 = blobCreate(in_stack_ffffffffffffffd8);
    if (state_00 == (blob_t)0x0) {
      return 0x6e;
    }
    beltHashStart(in_RDX);
    beltHashStepH(in_RDI,(size_t)in_RSI,in_RDX);
    beltHashStepG(in_RDX,state_00);
    blobClose((blob_t)0x14ab5a);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltHash(octet hash[32], const void* src, size_t count)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(src, count) || !memIsValid(hash, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHash_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// вычислить хэш-значение
	beltHashStart(state);
	beltHashStepH(src, count, state);
	beltHashStepG(hash, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}